

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O3

string * __thiscall
tinyusdz::to_string_abi_cxx11_(string *__return_storage_ptr__,tinyusdz *this,SubdivisionScheme v)

{
  char *pcVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  switch((ulong)this & 0xffffffff) {
  case 0:
    pcVar1 = "catmullClark";
    break;
  case 1:
    pcVar1 = "loop";
    break;
  case 2:
    pcVar1 = "bilinear";
    break;
  case 3:
    pcVar1 = "none";
    break;
  default:
    goto switchD_001e919e_default;
  }
  std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,(char *)0x0,(ulong)pcVar1);
switchD_001e919e_default:
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(tinyusdz::GeomMesh::SubdivisionScheme v) {
  std::string s;

  switch (v) {
    case tinyusdz::GeomMesh::SubdivisionScheme::CatmullClark: {
      s = "catmullClark";
      break;
    }
    case tinyusdz::GeomMesh::SubdivisionScheme::Loop: {
      s = "loop";
      break;
    }
    case tinyusdz::GeomMesh::SubdivisionScheme::Bilinear: {
      s = "bilinear";
      break;
    }
    case tinyusdz::GeomMesh::SubdivisionScheme::SubdivisionSchemeNone: {
      s = "none";
      break;
    }
  }

  return s;
}